

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

HighsSparseMatrix * __thiscall HEkk::getScaledAMatrixPointer(HEkk *this)

{
  HighsSparseMatrix *in_RDI;
  HighsSparseMatrix *local_scaled_a_matrix;
  HighsScale *in_stack_00000038;
  HighsSparseMatrix *in_stack_00000040;
  HighsSparseMatrix *this_00;
  
  this_00 = (HighsSparseMatrix *)
            &in_RDI[0x4d].value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  if ((((ulong)in_RDI[0x51].p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish & 0x100000000) != 0) &&
     ((in_RDI[0x52].num_row_ & 1) == 0)) {
    HighsSparseMatrix::operator=(this_00,in_RDI);
    HighsSparseMatrix::applyScale(in_stack_00000040,in_stack_00000038);
    this_00 = (HighsSparseMatrix *)&in_RDI[0x61].value_;
  }
  return this_00;
}

Assistant:

HighsSparseMatrix* HEkk::getScaledAMatrixPointer() {
  // Return a pointer to either the constraint matrix or a scaled copy
  // (that is a member of the HEkk class), with the latter returned if
  // the LP has scaling factors but is unscaled.
  HighsSparseMatrix* local_scaled_a_matrix = &(this->lp_.a_matrix_);
  if (this->lp_.scale_.has_scaling && !this->lp_.is_scaled_) {
    scaled_a_matrix_ = this->lp_.a_matrix_;
    scaled_a_matrix_.applyScale(this->lp_.scale_);
    local_scaled_a_matrix = &scaled_a_matrix_;
  }
  return local_scaled_a_matrix;
}